

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

string * cfgfile::generator::generate_type_of_data_abi_cxx11_(field_t *f)

{
  field_type_t fVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  field_t *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  allocator *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string local_90 [39];
  allocator local_69;
  string local_68 [32];
  string local_48 [55];
  allocator local_11;
  field_t *local_10;
  
  local_10 = in_RSI;
  fVar1 = cfg::field_t::type(in_RSI);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (ulong)(fVar1 - scalar_field_type);
  switch(__rhs) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    psVar2 = cfg::field_t::value_type_abi_cxx11_(local_10);
    std::__cxx11::string::string(in_RDI,(string *)psVar2);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"bool",&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"std::vector< ",&local_69);
    psVar2 = cfg::field_t::value_type_abi_cxx11_(local_10);
    std::operator+(psVar2,in_stack_ffffffffffffff30);
    paVar3 = (allocator *)&stack0xffffffffffffff6f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90," >",paVar3);
    std::operator+(in_stack_ffffffffffffff68,__rhs);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"void",(allocator *)&stack0xffffffffffffff6e);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6e);
  }
  return in_RDI;
}

Assistant:

static inline std::string generate_type_of_data( const cfg::field_t & f )
{
	switch( f.type() )
	{
		case cfg::field_t::no_value_field_type :
			return std::string( "bool" );

		case cfg::field_t::custom_tag_field_type :
		case cfg::field_t::scalar_field_type :
			return f.value_type();

		case cfg::field_t::vector_of_tags_field_type :
		case cfg::field_t::scalar_vector_field_type :
			return std::string( "std::vector< " ) + f.value_type() + std::string( " >" );

		default :
			return std::string( "void" );
	}
}